

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O1

void __thiscall
perfetto::internal::TrackRegistry::SerializeTrack<perfetto::CounterTrack>
          (TrackRegistry *this,CounterTrack *track,
          MessageHandle<perfetto::protos::pbzero::TracePacket> *packet)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  Message *pMVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  string desc_copy;
  undefined1 *local_40;
  size_t local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  
  local_38 = 0;
  local_30 = 0;
  local_40 = &local_30;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 != 0) {
    ::std::__throw_system_error(iVar2);
  }
  p_Var5 = (this->tracks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->tracks_)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = &p_Var1->_M_header;
  if (p_Var5 != (_Base_ptr)0x0) {
    do {
      bVar6 = *(ulong *)(p_Var5 + 1) < (track->super_Track).uuid;
      if (!bVar6) {
        p_Var4 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[bVar6];
    } while (p_Var5 != (_Base_ptr)0x0);
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (p_Var5 = p_Var4, (track->super_Track).uuid < *(ulong *)(p_Var4 + 1))) {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    ::std::__cxx11::string::_M_assign((string *)&local_40);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  pMVar3 = (packet->super_MessageHandleBase).message_;
  if (local_38 == 0) {
    pMVar3 = protozero::Message::BeginNestedMessageInternal(pMVar3,0x3c);
    CounterTrack::Serialize(track,(TrackDescriptor *)pMVar3);
  }
  else {
    (packet->super_MessageHandleBase).message_ = (Message *)0x0;
    protozero::Message::AppendBytes(pMVar3,0x3c,local_40,local_38);
    protozero::Message::Finalize(pMVar3);
  }
  if (local_40 != &local_30) {
    operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
  }
  return;
}

Assistant:

void SerializeTrack(
      const TrackType& track,
      protozero::MessageHandle<protos::pbzero::TracePacket> packet) {
    // If the track has extra metadata (recorded with UpdateTrack), it will be
    // found in the registry. To minimize the time the lock is held, make a copy
    // of the data held in the registry and write it outside the lock.
    std::string desc_copy;
    {
      std::lock_guard<std::mutex> lock(mutex_);
      const auto& it = tracks_.find(track.uuid);
      if (it != tracks_.end()) {
        desc_copy = it->second;
        PERFETTO_DCHECK(!desc_copy.empty());
      }
    }
    if (!desc_copy.empty()) {
      WriteTrackDescriptor(std::move(desc_copy), std::move(packet));
    } else {
      // Otherwise we just write the basic descriptor for this type of track
      // (e.g., just uuid, no name).
      track.Serialize(packet->set_track_descriptor());
    }
  }